

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Sym * find_D_Sym_in_Scope(D_Scope *st,D_Scope *cur,char *name,char *end)

{
  uint h_00;
  size_t sVar1;
  D_Sym *sym;
  undefined4 local_48;
  D_Sym *s;
  uint h;
  uint len;
  char *end_local;
  char *name_local;
  D_Scope *cur_local;
  D_Scope *st_local;
  
  if (end == (char *)0x0) {
    sVar1 = strlen(name);
    local_48 = (int)sVar1;
  }
  else {
    local_48 = (int)end - (int)name;
  }
  h_00 = strhashl(name,local_48);
  sym = find_D_Sym_in_Scope_internal(cur,name,local_48,h_00);
  if (sym == (D_Sym *)0x0) {
    st_local = (D_Scope *)0x0;
  }
  else {
    st_local = (D_Scope *)current_D_Sym(st,sym);
  }
  return (D_Sym *)st_local;
}

Assistant:

D_Sym *find_D_Sym_in_Scope(D_Scope *st, D_Scope *cur, char *name, char *end) {
  uint len = end ? end - name : strlen(name);
  uint h = strhashl(name, len);
  D_Sym *s = find_D_Sym_in_Scope_internal(cur, name, len, h);
  if (s) return current_D_Sym(st, s);
  return NULL;
}